

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpResize_Hermite
              (ARKodeMem_conflict ark_mem,ARKInterp interp,ARKVecResizeFn resize,void *resize_data,
              sunindextype lrw_diff,sunindextype liw_diff,N_Vector y0)

{
  sunrealtype sVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  if (interp != (ARKInterp)0x0) {
    iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                         (N_Vector *)((long)interp->content + 8));
    iVar4 = -0x14;
    if (iVar3 != 0) {
      iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                           (N_Vector *)((long)interp->content + 0x10));
      if (iVar3 != 0) {
        iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                             (N_Vector *)((long)interp->content + 0x18));
        if (iVar3 != 0) {
          iVar3 = arkResizeVec(ark_mem,resize,resize_data,lrw_diff,liw_diff,y0,
                               (N_Vector *)((long)interp->content + 0x20));
          if (iVar3 != 0) {
            sVar1 = ark_mem->tcur;
            pvVar2 = interp->content;
            *(sunrealtype *)((long)pvVar2 + 0x28) = sVar1;
            *(sunrealtype *)((long)pvVar2 + 0x30) = sVar1;
            *(undefined8 *)((long)pvVar2 + 0x38) = 0;
            iVar4 = 0;
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int arkInterpResize_Hermite(ARKodeMem ark_mem, ARKInterp interp,
                            ARKVecResizeFn resize, void* resize_data,
                            sunindextype lrw_diff, sunindextype liw_diff,
                            N_Vector y0)
{
  /* resize vectors */
  if (interp == NULL) { return (ARK_SUCCESS); }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FOLD(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_YOLD(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FA(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff, liw_diff, y0,
                    &HINT_FB(interp)))
  {
    return (ARK_MEM_FAIL);
  }

  /* reinitialize time values */
  HINT_TOLD(interp) = ark_mem->tcur;
  HINT_TNEW(interp) = ark_mem->tcur;
  HINT_H(interp)    = SUN_RCONST(0.0);

  return (ARK_SUCCESS);
}